

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2.hpp
# Opt level: O2

void __thiscall
crypto::hmac<crypto::iterated_hash<crypto::sha256_transform>_>::finalize
          (hmac<crypto::iterated_hash<crypto::sha256_transform>_> *this,hash_word *ostate,char *mac)

{
  char buffer [32];
  iterated_hash<crypto::sha256_transform> outer;
  
  iterated_hash<crypto::sha256_transform>::finalize(&this->inner,buffer);
  outer.count_lo = 0x40;
  outer.count_hi = 0;
  outer.state._0_8_ = *(undefined8 *)ostate;
  outer.state._8_8_ = *(undefined8 *)(ostate + 2);
  outer.state._16_8_ = *(undefined8 *)(ostate + 4);
  outer.state._24_8_ = *(undefined8 *)(ostate + 6);
  iterated_hash<crypto::sha256_transform>::update(&outer,buffer,0x20);
  iterated_hash<crypto::sha256_transform>::finalize(&outer,mac);
  return;
}

Assistant:

void finalize(const state_t ostate, char mac[hash_size]) {
		
		char buffer[hash_size];
		inner.finalize(buffer);
		
		T outer;
		outer.init(ostate, 1);
		outer.update(buffer, hash_size);
		outer.finalize(mac);
		
	}